

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

int __thiscall
TPZSkylMatrix<std::complex<float>_>::Decompose_LDLt
          (TPZSkylMatrix<std::complex<float>_> *this,list<long,_std::allocator<long>_> *singular)

{
  complex<float> *index;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  int64_t iVar3;
  complex<float> **ppcVar4;
  list<long,_std::allocator<long>_> *this_00;
  long lVar5;
  long lVar6;
  TPZBaseMatrix *in_RDI;
  int64_t k;
  complex<float> sum;
  int64_t dimension;
  int64_t minrow;
  int64_t minl;
  int64_t minj;
  int64_t l;
  int64_t j;
  complex<float> *ell;
  complex<float> *elj;
  char *in_stack_00000128;
  char *in_stack_00000130;
  complex<float> *in_stack_ffffffffffffff28;
  complex<float> in_stack_ffffffffffffff30;
  complex<float> *in_stack_ffffffffffffff38;
  TPZSkylMatrix<std::complex<float>_> *in_stack_ffffffffffffff40;
  complex<float> *__z;
  complex<float> *this_01;
  complex<float> local_98;
  long local_90;
  _ComplexT local_80;
  complex<float> *local_68;
  complex<float> local_60;
  long local_58;
  complex<float> *local_50;
  complex<float> *local_48;
  complex<float> *local_40;
  complex<float> *local_38;
  long local_30;
  complex<float> *local_28;
  complex<float> *local_20;
  
  if (in_RDI->fDecomposed != '\x04') {
    if (in_RDI->fDecomposed != '\0') {
      TPZMatrix<std::complex<float>_>::Error(in_stack_00000130,in_stack_00000128);
    }
    std::__cxx11::list<long,_std::allocator<long>_>::clear
              ((list<long,_std::allocator<long>_> *)in_stack_ffffffffffffff30._M_value);
    iVar2 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xc])();
    local_58 = CONCAT44(extraout_var,iVar2);
    std::complex<float>::complex(&local_60,0.0,0.0);
    for (local_30 = 1; lVar5 = local_30, local_30 < local_58; local_30 = local_30 + 1) {
      iVar3 = Size(in_stack_ffffffffffffff40,(int64_t)in_stack_ffffffffffffff38);
      local_40 = (complex<float> *)((lVar5 - iVar3) + 1);
      for (local_38 = local_40; (long)local_38 <= local_30;
          local_38 = (complex<float> *)((long)&local_38->_M_value + 1)) {
        this_01 = local_38;
        iVar3 = Size(in_stack_ffffffffffffff40,(int64_t)in_stack_ffffffffffffff38);
        local_48 = (complex<float> *)((long)this_01 + (1 - iVar3));
        __z = local_40;
        if ((long)local_40 < (long)local_48) {
          __z = local_48;
        }
        local_68 = __z;
        local_50 = __z;
        ppcVar4 = TPZVec<std::complex<float>_*>::operator[]
                            ((TPZVec<std::complex<float>_*> *)(in_RDI + 1),local_30);
        local_20 = *ppcVar4 + (local_30 - (long)local_50);
        ppcVar4 = TPZVec<std::complex<float>_*>::operator[]
                            ((TPZVec<std::complex<float>_*> *)(in_RDI + 1),(int64_t)local_38);
        local_28 = *ppcVar4 + ((long)local_38 - (long)local_50);
        std::complex<float>::operator=(&local_60,0.0);
        while ((long)local_68 < (long)local_38) {
          local_20 = local_20 + -1;
          local_28 = local_28 + -1;
          std::operator*(in_stack_ffffffffffffff28,(complex<float> *)0x136f7d8);
          index = local_68;
          local_68 = (complex<float> *)((long)&local_68->_M_value + 1);
          TPZVec<std::complex<float>_*>::operator[]
                    ((TPZVec<std::complex<float>_*> *)(in_RDI + 1),(int64_t)index);
          std::operator*(in_stack_ffffffffffffff28,(complex<float> *)0x136f809);
          std::complex<float>::operator+=
                    ((complex<float> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        }
        std::complex<float>::operator-=
                  ((complex<float> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        if (local_28 == local_20) {
          local_80 = local_20->_M_value;
          bVar1 = IsZero(in_stack_ffffffffffffff30);
          if (bVar1) {
            std::__cxx11::list<long,_std::allocator<long>_>::push_back
                      ((list<long,_std::allocator<long>_> *)in_stack_ffffffffffffff40,
                       (value_type_conflict5 *)in_stack_ffffffffffffff38);
            std::complex<float>::operator=(local_20,1.0);
          }
        }
        else {
          std::complex<float>::operator/=(this_01,__z);
        }
      }
    }
    iVar3 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar3 != 0) {
      iVar3 = TPZBaseMatrix::Rows(in_RDI);
      this_00 = (list<long,_std::allocator<long>_> *)(iVar3 + -1);
      iVar3 = TPZBaseMatrix::Rows(in_RDI);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,this_00,iVar3 + -1);
      bVar1 = IsZero(in_stack_ffffffffffffff30);
      if (bVar1) {
        iVar3 = TPZBaseMatrix::Rows(in_RDI);
        local_90 = iVar3 + -1;
        std::__cxx11::list<long,_std::allocator<long>_>::push_back
                  (this_00,(value_type_conflict5 *)in_stack_ffffffffffffff38);
        iVar3 = TPZBaseMatrix::Rows(in_RDI);
        lVar5 = iVar3 + -1;
        iVar3 = TPZBaseMatrix::Rows(in_RDI);
        lVar6 = iVar3 + -1;
        std::complex<float>::complex(&local_98,1.0,0.0);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar5,lVar6,&local_98);
      }
    }
    in_RDI->fDecomposed = '\x04';
    in_RDI->fDefPositive = '\0';
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Decompose_LDLt(std::list<int64_t> &singular)
{
    if( this->fDecomposed == ELDLt) return 1;
    if ( this->fDecomposed )
    {
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, "Decompose_LDLt <Matrix already Decomposed with different decomposition>" );
    }
    
#ifdef DUMP_BEFORE_DECOMPOSE
    dump_matrix(this, "TPZSkylMatrix::Decompose_LDLt(singular)");
#endif
    
    singular.clear();
    
    // Third try
    TVar *elj,*ell;
    int64_t j,l,minj,minl,minrow,dimension = this->Dim();
    TVar sum;
    j = 1;
    while(j < dimension) {
        minj = j-Size(j)+1;
        l = minj;
        while(l <= j) {
            minl = l-Size(l)+1;
            minrow = (minj<minl)? minl:minj;
            int64_t k = minrow;
            //			DiagkPtr = fDiag+minrow;
            elj = fElem[j]+j-minrow;
            ell = fElem[l]+l-minrow;
            sum = 0.;
            //EBORIN: 
            // Is this a hot spot?
            while(k < l) {
                sum += *elj-- * *ell-- * *(fElem[k++]);
            }
            *elj -= sum;
            if(ell != elj) *elj /= *ell;
            else if(IsZero(*elj)) {
                singular.push_back(l);
                *elj = 1.;
            }
            l++;
        }
        j++;
    }
    
    if(this->Rows() && IsZero(GetVal(this->Rows()-1,this->Rows()-1)))
    {
        singular.push_back(this->Rows()-1);
        PutVal(this->Rows()-1,this->Rows()-1,1.);
    }
    this->fDecomposed  = ELDLt;
    this->fDefPositive = 0;
    //if(Dim() > 100) cout << endl;
    return( 1 );
}